

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::logKernelInfo(CLIntercept *this,cl_kernel *kernels,cl_uint numKernels)

{
  double __x;
  uint uVar1;
  cl_device_info cVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  uint in_EDX;
  undefined8 *in_RSI;
  CLIntercept *in_RDI;
  float __x_00;
  float __x_01;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float __x_02;
  float fVar5;
  cl_int errorCode_regCount;
  cl_uint regCount;
  cl_int errorCode_sms;
  cl_ulong sms;
  cl_ulong lms;
  cl_ulong pms;
  size_t rwgs [3];
  size_t wgs;
  size_t pwgsm;
  cl_uint args;
  char *deviceName;
  cl_uint i;
  string *kernelName;
  cl_kernel kernel;
  cl_device_id *deviceList;
  cl_uint numDevices;
  cl_program program;
  cl_kernel queryKernel;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffdf8;
  lock_guard<std::mutex> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  cl_device_id **in_stack_fffffffffffffe18;
  cl_uint *in_stack_fffffffffffffe20;
  SConfig *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  cl_device_info in_stack_fffffffffffffe34;
  cl_icd_dispatch *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  cl_int in_stack_fffffffffffffe44;
  cl_icd_dispatch *in_stack_fffffffffffffe48;
  undefined4 local_128;
  cl_int local_124;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  long local_108;
  long lStack_100;
  long local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  uint local_c4;
  cl_kernel in_stack_ffffffffffffff40;
  CLIntercept *in_stack_ffffffffffffff48;
  string local_a0 [32];
  string local_80 [32];
  string *local_60;
  cl_kernel local_58;
  void *local_50;
  uint local_48;
  undefined8 local_38;
  cl_kernel local_30;
  uint local_24;
  uint local_14;
  undefined8 *local_10;
  
  if (in_EDX != 0) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_24 = 0;
    local_30 = (cl_kernel)*local_10;
    local_38 = 0;
    pcVar3 = dispatch(in_RDI);
    local_24 = (*pcVar3->clGetKernelInfo)(local_30,0x1194,8,&local_38,(size_t *)0x0);
    local_48 = 0;
    local_50 = (void *)0x0;
    if (local_24 == 0) {
      local_24 = allocateAndGetProgramDeviceList
                           ((CLIntercept *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (cl_program)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18);
    }
    while( true ) {
      uVar1 = local_14;
      if (local_48 != 0) {
        local_14 = local_14 - 1;
      }
      if (local_48 == 0 || uVar1 == 0) break;
      local_58 = (cl_kernel)local_10[local_14];
      getShortKernelNameWithHash_abi_cxx11_(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_60 = local_80;
      std::operator+((char *)in_stack_fffffffffffffe48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      __x = (double)std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
      log(in_RDI,__x);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      for (local_c4 = 0; local_c4 < local_48; local_c4 = local_c4 + 1) {
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_24 = allocateAndGetDeviceInfoString
                             ((CLIntercept *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              (cl_device_id)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                              (char **)in_stack_fffffffffffffe28);
        local_d4 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar1 = (*pcVar3->clGetKernelInfo)(local_58,0x1191,4,&local_d4,(size_t *)0x0);
        local_24 = local_24 | uVar1;
        local_e0 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar1 = (*pcVar3->clGetKernelWorkGroupInfo)
                          (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x11b3,8
                           ,&local_e0,(size_t *)0x0);
        local_24 = local_24 | uVar1;
        local_e8 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar1 = (*pcVar3->clGetKernelWorkGroupInfo)
                          (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x11b0,8
                           ,&local_e8,(size_t *)0x0);
        local_24 = local_24 | uVar1;
        local_108 = 0;
        lStack_100 = 0;
        local_f8 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar1 = (*pcVar3->clGetKernelWorkGroupInfo)
                          (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x11b1,
                           0x18,&local_108,(size_t *)0x0);
        local_24 = local_24 | uVar1;
        local_110 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar1 = (*pcVar3->clGetKernelWorkGroupInfo)
                          (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x11b4,8
                           ,&local_110,(size_t *)0x0);
        local_24 = local_24 | uVar1;
        local_118 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar1 = (*pcVar3->clGetKernelWorkGroupInfo)
                          (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x11b2,8
                           ,&local_118,(size_t *)0x0);
        local_24 = local_24 | uVar1;
        local_120 = 0;
        in_stack_fffffffffffffe48 = dispatch(in_RDI);
        in_stack_fffffffffffffe44 =
             (*in_stack_fffffffffffffe48->clGetKernelWorkGroupInfo)
                       (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x4109,8,
                        &local_120,(size_t *)0x0);
        local_128 = 0;
        local_124 = in_stack_fffffffffffffe44;
        in_stack_fffffffffffffe38 = dispatch(in_RDI);
        cVar2 = (*in_stack_fffffffffffffe38->clGetKernelWorkGroupInfo)
                          (local_58,*(cl_device_id *)((long)local_50 + (ulong)local_c4 * 8),0x425b,4
                           ,&local_128,(size_t *)0x0);
        if (local_24 == 0) {
          in_stack_fffffffffffffe34 = cVar2;
          logf(in_RDI,__x_00);
          in_stack_fffffffffffffe28 = config(in_RDI);
          if ((in_stack_fffffffffffffe28->KernelInfoLogging & 1U) != 0) {
            logf(in_RDI,__x_01);
          }
          pSVar4 = config(in_RDI);
          fVar5 = extraout_XMM0_Da;
          if (((pSVar4->KernelInfoLogging & 1U) != 0) ||
             (pSVar4 = config(in_RDI), fVar5 = extraout_XMM0_Da_00,
             (pSVar4->PreferredWorkGroupSizeMultipleLogging & 1U) != 0)) {
            logf(in_RDI,fVar5);
          }
          pSVar4 = config(in_RDI);
          if ((pSVar4->KernelInfoLogging & 1U) != 0) {
            fVar5 = logf(in_RDI,__x_02);
            if (((local_108 != 0) || (lStack_100 != 0)) || (local_f8 != 0)) {
              fVar5 = logf(in_RDI,fVar5);
            }
            fVar5 = logf(in_RDI,fVar5);
            fVar5 = logf(in_RDI,fVar5);
            if (local_124 == 0) {
              fVar5 = logf(in_RDI,fVar5);
            }
            if (cVar2 == 0) {
              logf(in_RDI,fVar5);
            }
          }
        }
        else if (local_d0 ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          logf(in_RDI,__x_00);
          in_stack_fffffffffffffe34 = cVar2;
        }
        else {
          logf(in_RDI,__x_00);
          in_stack_fffffffffffffe34 = cVar2;
        }
        in_stack_fffffffffffffe08 = local_d0;
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_d0);
        }
      }
      std::__cxx11::string::~string(local_80);
    }
    if (local_50 != (void *)0x0) {
      operator_delete__(local_50);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f6143);
  }
  return;
}

Assistant:

void CLIntercept::logKernelInfo(
    const cl_kernel* kernels,
    cl_uint numKernels )
{
    if( numKernels > 0 )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;

        // We can share the program and device list for all kernels.

        cl_kernel   queryKernel = kernels[0];

        // First, get the program for this kernel.
        cl_program  program = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetKernelInfo(
                queryKernel,
                CL_KERNEL_PROGRAM,
                sizeof(program),
                &program,
                NULL );
        }

        // Next, get the list of devices for the program.
        cl_uint         numDevices = 0;
        cl_device_id*   deviceList = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = allocateAndGetProgramDeviceList(
                program,
                numDevices,
                deviceList );
        }

        // Log the preferred work group size multiple for each kernel,
        // for each device.
        while( numDevices && numKernels-- )
        {
            cl_kernel   kernel = kernels[ numKernels ];

            const std::string& kernelName = getShortKernelNameWithHash(kernel);
            log( "Kernel Info for: " + kernelName + "\n" );

            for( cl_uint i = 0; i < numDevices; i++ )
            {
                char*   deviceName = NULL;
                errorCode = allocateAndGetDeviceInfoString(
                    deviceList[i],
                    CL_DEVICE_NAME,
                    deviceName );

                cl_uint args = 0;
                errorCode |= dispatch().clGetKernelInfo(
                    kernel,
                    CL_KERNEL_NUM_ARGS,
                    sizeof(args),
                    &args,
                    NULL );

                size_t  pwgsm = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );
                size_t  wgs = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_WORK_GROUP_SIZE,
                    sizeof(wgs),
                    &wgs,
                    NULL );
                size_t  rwgs[3] = {0, 0, 0};
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_COMPILE_WORK_GROUP_SIZE,
                    sizeof(rwgs),
                    rwgs,
                    NULL );
                cl_ulong pms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(pms),
                    &pms,
                    NULL );
                cl_ulong lms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(lms),
                    &lms,
                    NULL );
                cl_ulong sms = 0;
                cl_int errorCode_sms = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(sms),
                    &sms,
                    NULL );
                cl_uint regCount = 0;
                cl_int errorCode_regCount = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( errorCode == CL_SUCCESS )
                {
                    logf( "    For device: %s\n",
                        deviceName );
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Num Args: %u\n", args);
                    }
                    if( config().KernelInfoLogging ||
                        config().PreferredWorkGroupSizeMultipleLogging )
                    {
                        logf( "        Preferred Work Group Size Multiple: %zu\n", pwgsm);
                    }
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Max Work Group Size: %zu\n", wgs);
                        if( rwgs[0] != 0 || rwgs[1] != 0 || rwgs[2] != 0 )
                        {
                            logf( "        Required Work Group Size: < %zu, %zu, %zu >\n",
                                rwgs[0], rwgs[1], rwgs[2]);
                        }
                        logf( "        Private Mem Size: %u\n", (cl_uint)pms);
                        logf( "        Local Mem Size: %u\n", (cl_uint)lms);
                        if( errorCode_sms == CL_SUCCESS )
                        {
                            logf( "        Spill Mem Size: %u\n", (cl_uint)sms);
                        }
                        if( errorCode_regCount == CL_SUCCESS )
                        {
                            logf( "        Register Count: %u\n", regCount);
                        }
                    }
                }
                else if( deviceName )
                {
                    logf( "Error querying kernel info for device %s!\n", deviceName );
                }
                else
                {
                    logf( "Error querying kernel info!\n" );
                }

                delete [] deviceName;
            }
        }

        delete [] deviceList;
    }
}